

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_atof.h
# Opt level: O3

uint64_t Assimp::strtoul10_64(char *in,char **out,uint *max_inout)

{
  ulong uVar1;
  char *pcVar2;
  ulong uVar3;
  Logger *this;
  ostream *poVar4;
  invalid_argument *this_00;
  long *plVar5;
  long *plVar6;
  char *pcVar7;
  long lVar8;
  long lVar9;
  bool bVar10;
  char *local_1f0;
  long *local_1e8;
  long local_1e0;
  long local_1d8;
  long lStack_1d0;
  undefined1 *local_1c8 [2];
  undefined1 local_1b8 [16];
  long *local_1a8;
  long local_1a0;
  long local_198;
  long lStack_190;
  ios_base local_138 [264];
  
  if ((byte)(*in - 0x3aU) < 0xf6) {
    local_1f0 = in;
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    local_1c8[0] = local_1b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"The string \"","");
    plVar5 = (long *)std::__cxx11::string::append((char *)local_1c8);
    local_1e8 = (long *)*plVar5;
    plVar6 = plVar5 + 2;
    if (local_1e8 == plVar6) {
      local_1d8 = *plVar6;
      lStack_1d0 = plVar5[3];
      local_1e8 = &local_1d8;
    }
    else {
      local_1d8 = *plVar6;
    }
    local_1e0 = plVar5[1];
    *plVar5 = (long)plVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_1e8);
    local_1a8 = (long *)*plVar5;
    plVar6 = plVar5 + 2;
    if (local_1a8 == plVar6) {
      local_198 = *plVar6;
      lStack_190 = plVar5[3];
      local_1a8 = &local_198;
    }
    else {
      local_198 = *plVar6;
    }
    local_1a0 = plVar5[1];
    *plVar5 = (long)plVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::invalid_argument::invalid_argument(this_00,(string *)&local_1a8);
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  lVar8 = 1;
  lVar9 = 0;
  uVar3 = (ulong)(byte)(*in - 0x30);
  while( true ) {
    if ((max_inout != (uint *)0x0) && ((uint)lVar8 == *max_inout)) {
      pcVar7 = in + (1 - lVar9);
      if (out == (char **)0x0) {
        return uVar3;
      }
      if ((byte)(in[lVar8] - 0x30U) < 10) {
        pcVar2 = in + (2 - lVar9);
        do {
          pcVar7 = pcVar2;
          pcVar2 = pcVar7 + 1;
        } while ((byte)(*pcVar7 - 0x30U) < 10);
      }
      *out = pcVar7;
      return uVar3;
    }
    if ((byte)(in[lVar8] - 0x3aU) < 0xf6) break;
    uVar1 = (ulong)(byte)(in[lVar8] - 0x30) + uVar3 * 10;
    lVar9 = lVar9 + -1;
    lVar8 = lVar8 + 1;
    bVar10 = uVar1 < uVar3;
    uVar3 = uVar1;
    if (bVar10) {
      local_1f0 = in + -lVar9;
      this = DefaultLogger::get();
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[24]>
                ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1a8,
                 (char (*) [24])"Converting the string \"");
      poVar4 = (ostream *)
               Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
               operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                         &local_1a8,&local_1f0);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,"\" into a value resulted in overflow.",0x24);
      std::__cxx11::stringbuf::str();
      Logger::warn(this,(char *)local_1e8);
      if (local_1e8 != &local_1d8) {
        operator_delete(local_1e8);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      std::ios_base::~ios_base(local_138);
      return 0;
    }
  }
  if (out != (char **)0x0) {
    *out = in + (1 - lVar9);
  }
  if (max_inout == (uint *)0x0) {
    return uVar3;
  }
  *max_inout = (uint)lVar8;
  return uVar3;
}

Assistant:

inline
uint64_t strtoul10_64( const char* in, const char** out=0, unsigned int* max_inout=0) {
    unsigned int cur = 0;
    uint64_t value = 0;

    if ( *in < '0' || *in > '9' ) {
        throw std::invalid_argument( std::string( "The string \"" ) + in + "\" cannot be converted into a value." );
    }

    for ( ;; ) {
        if ( *in < '0' || *in > '9' ) {
            break;
        }

        const uint64_t new_value = ( value * (uint64_t) 10 ) + ( (uint64_t) ( *in - '0' ) );

        // numeric overflow, we rely on you
        if ( new_value < value ) {
            ASSIMP_LOG_WARN_F( "Converting the string \"", in, "\" into a value resulted in overflow." );
            return 0;
        }

        value = new_value;

        ++in;
        ++cur;

        if (max_inout && *max_inout == cur) {
            if (out) { /* skip to end */
                while ( *in >= '0' && *in <= '9' ) {
                    ++in;
                }
                *out = in;
            }

            return value;
        }
    }
    if ( out ) {
        *out = in;
    }

    if ( max_inout ) {
        *max_inout = cur;
    }

    return value;
}